

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

pair<unsigned_long,_int> mxx::max_element<unsigned_long>(unsigned_long *x,comm *comm)

{
  pair<unsigned_long,_int> pVar1;
  
  pVar1 = allreduce<std::pair<unsigned_long,int>,mxx::max_element<unsigned_long>(unsigned_long_const&,mxx::comm_const&)::_lambda(std::pair<unsigned_long,int>const&,std::pair<unsigned_long,int>const&)_1_>
                    ();
  return pVar1;
}

Assistant:

inline std::pair<T, int> max_element(const T& x, const mxx::comm& comm = mxx::comm()) {
    if (mxx::is_builtin_pair_type<T>::value) {
        MPI_Datatype dt = mxx::datatype_pair<T>::get_type();
        struct {
            T value;
            int rank;
        } in, out;
        in.value = x;
        in.rank = comm.rank();
        MPI_Allreduce(&in, &out, 1, dt, MPI_MAXLOC, comm);
        return std::make_pair(out.value, out.rank);
    } else {
        // use custom operator
        std::pair<T, int> in = std::make_pair(x, comm.rank());
        return mxx::allreduce(in, [](const std::pair<T, int>& x, const std::pair<T, int>& y) { return x.first < y.first ? y : x;}, comm);
    }
}